

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmBitFieldDn<(moira::Instr)134,(moira::Mode)6,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char **s;
  u32 uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  char *pcVar7;
  char cVar8;
  byte bVar9;
  Dn dn;
  uint uVar10;
  undefined1 local_44 [20];
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  uVar3 = (*this->_vptr_Moira[6])();
  uVar10 = uVar3 & 0xffff;
  if ((0xfff < uVar10) && ((str->style->syntax & ~MOIRA_MIT) == GNU)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)134,(moira::Mode)6,4>(this,str,addr,op);
    return;
  }
  uVar4 = uVar10 >> 6;
  uVar5 = uVar4 & 0x1f;
  s = &str->ptr;
  cVar8 = 'b';
  lVar6 = 1;
  do {
    pcVar7 = *s;
    *s = pcVar7 + 1;
    *pcVar7 = cVar8;
    cVar8 = "bfchg"[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 6);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar7 = *s;
    *s = pcVar7 + 1;
    *pcVar7 = ' ';
  }
  else {
    iVar2 = (str->tab).raw;
    do {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = ' ';
    } while (str->ptr < str->base + iVar2);
  }
  Op<(moira::Mode)6,4>((Ea<(moira::Mode)6,_4> *)local_44,this,op & 7,addr);
  StrWriter::operator<<(str,(Ea<(moira::Mode)6,_4> *)local_44);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    uVar10 = uVar3 & 0x820;
    pcVar7 = *s;
    *s = pcVar7 + 1;
    *pcVar7 = ',';
    if (uVar10 < 0x800) {
      if (uVar10 != 0) {
        sprintd_signed(s,(ulong)uVar5);
LAB_003c207a:
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = ',';
        StrWriter::operator<<(str,(Dn)(uVar3 & 7));
        goto LAB_003c2098;
      }
      sprintd_signed(s,(ulong)uVar5);
      pcVar7 = *s;
      *s = pcVar7 + 1;
    }
    else {
      if (uVar10 != 0x800) {
        StrWriter::operator<<(str,(Dn)(uVar4 & 7));
        goto LAB_003c207a;
      }
      StrWriter::operator<<(str,(Dn)(uVar4 & 7));
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
    }
    *pcVar7 = ',';
    sprintd_signed(s,(ulong)(uVar3 & 0x1f));
    goto LAB_003c2098;
  }
  bVar9 = 0x20;
  if ((uVar3 & 0x1f) != 0) {
    bVar9 = (byte)uVar10 & 0x1f;
  }
  uVar3 = uVar3 & 0x820;
  cVar8 = ' ';
  lVar6 = 0;
  if (uVar3 < 0x800) {
    if (uVar3 != 0) {
      do {
        pcVar7 = *s;
        *s = pcVar7 + 1;
        *pcVar7 = cVar8;
        cVar8 = " {"[lVar6 + 1];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 2);
      sprintd_signed(s,(ulong)uVar5);
LAB_003c202d:
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = ':';
      dn.raw._1_3_ = 0;
      dn.raw._0_1_ = bVar9 & 7;
      StrWriter::operator<<(str,dn);
      goto LAB_003c204c;
    }
    do {
      pcVar7 = *s;
      *s = pcVar7 + 1;
      *pcVar7 = cVar8;
      cVar8 = " {"[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 2);
    sprintd_signed(s,(ulong)uVar5);
    pcVar7 = *s;
    *s = pcVar7 + 1;
    *pcVar7 = ':';
    sprintd_signed(s,(ulong)bVar9);
    pcVar7 = *s;
    *s = pcVar7 + 1;
  }
  else {
    if (uVar3 != 0x800) {
      do {
        pcVar7 = *s;
        *s = pcVar7 + 1;
        *pcVar7 = cVar8;
        cVar8 = " {"[lVar6 + 1];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 2);
      StrWriter::operator<<(str,(Dn)(uVar4 & 7));
      goto LAB_003c202d;
    }
    do {
      pcVar7 = *s;
      *s = pcVar7 + 1;
      *pcVar7 = cVar8;
      cVar8 = " {"[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 2);
    StrWriter::operator<<(str,(Dn)(uVar4 & 7));
    pcVar7 = str->ptr;
    str->ptr = pcVar7 + 1;
    *pcVar7 = ':';
    sprintd_signed(s,(ulong)bVar9);
LAB_003c204c:
    pcVar7 = str->ptr;
    str->ptr = pcVar7 + 1;
  }
  *pcVar7 = '}';
LAB_003c2098:
  if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
    cVar8 = ';';
    lVar6 = 1;
    do {
      pcVar7 = *s;
      *s = pcVar7 + 1;
      *pcVar7 = cVar8;
      cVar8 = "trap%-2s  ; (2+)"[lVar6 + 10];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 7);
  }
  return;
}

Assistant:

void
Moira::dasmBitFieldDn(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead <Word>(addr);
    auto dst = _____________xxx(op);
    auto o   = _____xxxxx______(ext);
    auto w   = ___________xxxxx(ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExt(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{} << str.tab;

    if constexpr (I == Instr::BFINS) {
        str << Dn ( _xxx____________(ext) ) << Sep{};
    }

    str << Op<M, S>(dst, addr);

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            switch (ext & 0x0820) {

                case 0x0000: str << "," << o << "," << w; break;
                case 0x0020: str << "," << o << "," << Dn{w&7}; break;
                case 0x0800: str << "," << Dn{o&7} << "," << w; break;
                case 0x0820: str << "," << Dn{o&7} << "," << Dn{w&7}; break;
            }
            break;

        default:

            if (w == 0) w = 32;

            switch (ext & 0x0820) {

                case 0x0000: str << " {" << o << ":" << w << "}"; break;
                case 0x0020: str << " {" << o << ":" << Dn{w&7} << "}"; break;
                case 0x0800: str << " {" << Dn{o&7} << ":" << w << "}"; break;
                case 0x0820: str << " {" << Dn{o&7} << ":" << Dn{w&7} << "}"; break;
            }
    }

    if constexpr (I == Instr::BFEXTU || I == Instr::BFEXTS || I == Instr::BFFFO) {
        str << Sep{} << Dn ( _xxx____________(ext) );
    }
    str << Av<I, M, S>{};
}